

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O1

void __thiscall QButtonGroup::setId(QButtonGroup *this,QAbstractButton *button,int id)

{
  long in_FS_OFFSET;
  QAbstractButton *local_38;
  TryEmplaceResult local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = button;
  if (id != -1 && button != (QAbstractButton *)0x0) {
    QHash<QAbstractButton*,int>::tryEmplace_impl<QAbstractButton*const&>
              (&local_30,(QHash<QAbstractButton*,int> *)(*(long *)&this->field_0x8 + 0xa8),&local_38
              );
    *(int *)((local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].entries
             [(local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].offsets
              [(uint)local_30.iterator.i.bucket & 0x7f]].storage.data + 8) = id;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QButtonGroup::setId(QAbstractButton *button, int id)
{
    Q_D(QButtonGroup);
    if (button && id != -1)
        d->mapping[button] = id;
}